

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

void __thiscall State::State(State *this)

{
  State *this_local;
  
  std::
  unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
  ::unordered_map(&this->paths_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::map(&this->pools_);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::vector(&this->edges_);
  BindingEnv::BindingEnv(&this->bindings_);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->defaults_);
  BindingEnv::AddRule(&this->bindings_,&kPhonyRule);
  AddPool(this,&kDefaultPool);
  AddPool(this,&kConsolePool);
  return;
}

Assistant:

State::State() {
  bindings_.AddRule(&kPhonyRule);
  AddPool(&kDefaultPool);
  AddPool(&kConsolePool);
}